

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigation.cpp
# Opt level: O2

void __thiscall despot::Navigation::Init(Navigation *this,istream *is)

{
  int *piVar1;
  int *piVar2;
  vector<double,_std::allocator<double>_> *this_00;
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  *this_01;
  double dVar3;
  pointer pdVar4;
  pointer pvVar5;
  long lVar6;
  byte bVar7;
  int iVar8;
  istream *piVar9;
  istream *this_02;
  NavigationState *pNVar10;
  unsigned_long uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  double dVar19;
  long local_b0;
  State local_70 [32];
  string tok;
  
  tok._M_dataplus._M_p = (pointer)&tok.field_2;
  tok._M_string_length = 0;
  tok.field_2._M_local_buf[0] = '\0';
  piVar9 = std::operator>>(is,(string *)&tok);
  piVar9 = std::operator>>(piVar9,(string *)&tok);
  piVar1 = &this->ysize_;
  this_02 = (istream *)std::istream::operator>>((istream *)piVar9,piVar1);
  piVar2 = &this->xsize_;
  std::istream::operator>>(this_02,piVar2);
  std::vector<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>::resize
            (&this->states_,((long)this->ysize_ * (long)this->xsize_ + 1) * (long)flag_size_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->obs_,(long)this->ysize_ * (long)this->xsize_ + 1);
  this_00 = &this->trap_prob_;
  std::vector<double,_std::allocator<double>_>::resize
            (this_00,(long)this->ysize_ * (long)this->xsize_ + 1);
  iVar8 = this->xsize_;
  iVar15 = this->ysize_;
  this->trap_pos_ = iVar15 * iVar8;
  iVar12 = 0;
  do {
    if (iVar15 <= iVar12) {
      uVar17 = (ulong)this->trap_pos_;
      (this->obs_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar17] = 4;
      (this->trap_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar17] = 1.0;
      iVar8 = flag_size_;
      for (lVar14 = 0; (int)lVar14 < iVar8; lVar14 = lVar14 + 1) {
        pNVar10 = (NavigationState *)operator_new(0x20);
        NavigationState::NavigationState(pNVar10,(int)uVar17 * iVar8 + (int)lVar14);
        iVar8 = flag_size_;
        uVar17 = (ulong)(uint)this->trap_pos_;
        (this->states_).
        super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>.
        _M_impl.super__Vector_impl_data._M_start[this->trap_pos_ * flag_size_ + lVar14] = pNVar10;
      }
      this_01 = &this->transition_probabilities_;
      std::
      vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
      ::resize(this_01,(long)(this->states_).
                             super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->states_).
                             super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar17 = 0;
      do {
        if ((ulong)((long)(this->states_).
                          super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->states_).
                          super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar17) {
          std::__cxx11::string::~string((string *)&tok);
          return;
        }
        pvVar5 = (this->transition_probabilities_).
                 super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar8 = (**(code **)(*(long *)this + 0x28))();
        std::
        vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
        ::resize(pvVar5 + uVar17,(long)iVar8);
        local_b0 = 0;
        lVar14 = 0;
        while( true ) {
          iVar8 = (**(code **)(*(long *)this + 0x28))();
          if (iVar8 <= lVar14) break;
          uVar16 = (uint)uVar17;
          lVar6 = (long)flag_size_;
          bVar7 = flag_bits_ & 0x1f;
          iVar8 = NextPosition(this,uVar16 >> bVar7,(ACT_TYPE)lVar14);
          uVar18 = (uint)((long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar17 & 0xffffffff) %
                         lVar6);
          if (uVar18 == 1) {
            lVar6 = *(long *)&(this_01->
                              super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar17].
                              super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            if (uVar16 >> bVar7 == 0) {
              despot::State::State(local_70,flag_size_ + 3,0.49);
              std::vector<despot::State,_std::allocator<despot::State>_>::
              emplace_back<despot::State>
                        ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b0)
                         ,local_70);
              despot::State::~State(local_70);
              lVar6 = *(long *)&(this_01->
                                super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar17].
                                super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                                ._M_impl.super__Vector_impl_data;
              despot::State::State(local_70,(*piVar2 + -2) * flag_size_ + 7,0.51);
              std::vector<despot::State,_std::allocator<despot::State>_>::
              emplace_back<despot::State>
                        ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b0)
                         ,local_70);
            }
            else {
              despot::State::State(local_70,uVar16,1.0);
              std::vector<despot::State,_std::allocator<despot::State>_>::
              emplace_back<despot::State>
                        ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b0)
                         ,local_70);
            }
LAB_00108f84:
            despot::State::~State(local_70);
          }
          else {
            if (uVar18 == 0) {
              lVar6 = *(long *)&(this_01->
                                super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar17].
                                super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                                ._M_impl.super__Vector_impl_data;
              if (uVar16 >> bVar7 == 0) {
                despot::State::State(local_70,1,1.0);
                std::vector<despot::State,_std::allocator<despot::State>_>::
                emplace_back<despot::State>
                          ((vector<despot::State,_std::allocator<despot::State>_> *)
                           (lVar6 + local_b0),local_70);
              }
              else {
                despot::State::State(local_70,uVar16,1.0);
                std::vector<despot::State,_std::allocator<despot::State>_>::
                emplace_back<despot::State>
                          ((vector<despot::State,_std::allocator<despot::State>_> *)
                           (lVar6 + local_b0),local_70);
              }
              goto LAB_00108f84;
            }
            if ((uVar18 & 0x7ffffffb) != 3) {
              lVar6 = *(long *)&(this_01->
                                super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar17].
                                super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                                ._M_impl.super__Vector_impl_data;
              despot::State::State(local_70,uVar16,1.0);
              std::vector<despot::State,_std::allocator<despot::State>_>::
              emplace_back<despot::State>
                        ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b0)
                         ,local_70);
              goto LAB_00108f84;
            }
            dVar3 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[iVar8];
            dVar19 = 1.0 - dVar3;
            if (0.0 < dVar19) {
              lVar6 = *(long *)&(this_01->
                                super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar17].
                                super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                                ._M_impl.super__Vector_impl_data;
              despot::State::State(local_70,flag_size_ * iVar8 + 3,dVar19 * 0.49);
              std::vector<despot::State,_std::allocator<despot::State>_>::
              emplace_back<despot::State>
                        ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b0)
                         ,local_70);
              despot::State::~State(local_70);
              lVar6 = *(long *)&(this_01->
                                super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar17].
                                super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                                ._M_impl.super__Vector_impl_data;
              despot::State::State(local_70,iVar8 * flag_size_ + 7,dVar19 * 0.51);
              std::vector<despot::State,_std::allocator<despot::State>_>::
              emplace_back<despot::State>
                        ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b0)
                         ,local_70);
              despot::State::~State(local_70);
            }
            if (0.0 < dVar3) {
              lVar6 = *(long *)&(this->transition_probabilities_).
                                super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar17].
                                super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                                ._M_impl.super__Vector_impl_data;
              despot::State::State(local_70,flag_size_ * this->trap_pos_ + 3,dVar3 * 0.49);
              std::vector<despot::State,_std::allocator<despot::State>_>::
              emplace_back<despot::State>
                        ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b0)
                         ,local_70);
              despot::State::~State(local_70);
              lVar6 = *(long *)&(this->transition_probabilities_).
                                super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar17].
                                super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                                ._M_impl.super__Vector_impl_data;
              despot::State::State(local_70,flag_size_ * this->trap_pos_ + 7,dVar3 * 0.51);
              std::vector<despot::State,_std::allocator<despot::State>_>::
              emplace_back<despot::State>
                        ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b0)
                         ,local_70);
              goto LAB_00108f84;
            }
          }
          lVar14 = lVar14 + 1;
          local_b0 = local_b0 + 0x18;
        }
        uVar17 = uVar17 + 1;
      } while( true );
    }
    for (iVar15 = 0; iVar15 < iVar8; iVar15 = iVar15 + 1) {
      iVar13 = iVar8 * iVar12 + iVar15;
      iVar8 = flag_size_;
      for (lVar14 = 0; (int)lVar14 < iVar8; lVar14 = lVar14 + 1) {
        pNVar10 = (NavigationState *)operator_new(0x20);
        NavigationState::NavigationState(pNVar10,iVar8 * iVar13 + (int)lVar14);
        iVar8 = flag_size_;
        (this->states_).
        super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>.
        _M_impl.super__Vector_impl_data._M_start[iVar13 * flag_size_ + lVar14] = pNVar10;
      }
      std::istream::_M_extract<double>((double *)is);
      pdVar4 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      dVar3 = pdVar4[iVar13];
      if ((dVar3 == -1.0) && (!NAN(dVar3))) {
        this->goal_pos_ = iVar13;
        pdVar4[iVar13] = 0.0;
      }
      if (iVar15 == 0 && iVar12 == 0) {
        uVar11 = 0;
      }
      else {
        if (iVar12 == 0) {
          uVar11 = 1;
          if (iVar15 == *piVar2 + -1) goto LAB_00108b21;
        }
        uVar11 = 2;
        if (iVar12 != *piVar1 + -1 || iVar15 != 0) {
          if (iVar12 == *piVar1 + -1) {
            uVar11 = 3;
            if (iVar15 == *piVar2 + -1) goto LAB_00108b21;
          }
          uVar11 = 4;
        }
      }
LAB_00108b21:
      (this->obs_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[iVar13] = uVar11;
      iVar8 = *piVar2;
    }
    iVar12 = iVar12 + 1;
    iVar15 = *piVar1;
  } while( true );
}

Assistant:

void Navigation::Init(istream& is) {
	string tok;
	is >> tok >> tok >> ysize_ >> xsize_;
	states_.resize(flag_size_ * (xsize_ * ysize_ + 1));
	obs_.resize(xsize_ * ysize_ + 1);
	trap_prob_.resize(xsize_ * ysize_ + 1);
	trap_pos_ = xsize_ * ysize_;
	for (int y = 0; y < ysize_; y++) {
		for (int x = 0; x < xsize_; x++) {
			int pos = y * xsize_ + x;
			for (int i = 0; i < flag_size_; i++)
				states_[flag_size_ * pos + i] = new NavigationState(
					flag_size_ * pos + i);

			is >> trap_prob_[pos];

			if (trap_prob_[pos] == -1) {
				goal_pos_ = pos;
				trap_prob_[pos] = 0;
			}

			if (y == 0 && x == 0)
				obs_[pos] = 0;
			else if (y == 0 && x == xsize_ - 1)
				obs_[pos] = 1;
			else if (y == ysize_ - 1 && x == 0)
				obs_[pos] = 2;
			else if (y == ysize_ - 1 && x == xsize_ - 1)
				obs_[pos] = 3;
			else
				obs_[pos] = 4;
		}
	}
	obs_[trap_pos_] = 4;
	trap_prob_[trap_pos_] = 1.0;
	for (int i = 0; i < flag_size_; i++) {
		states_[flag_size_ * trap_pos_ + i] = new NavigationState(
			flag_size_ * trap_pos_ + i);
	}

	// Build transition matrix
	transition_probabilities_.resize(states_.size());
	for (int s = 0; s < states_.size(); s++) {
		transition_probabilities_[s].resize(NumActions());

		for (int a = 0; a < NumActions(); a++) {
			int flag = s % flag_size_;
			int pos = s >> flag_bits_;
			int next_pos = NextPosition(pos, a);

			if (flag == 0) { // Transition for first step
				if (pos == 0) {
					transition_probabilities_[s][a].push_back(State(1, 1.0));
				} else { // Self transition
					transition_probabilities_[s][a].push_back(State(s, 1.0));
				}
			} else if (flag == 1) { // Transition for second step
				if (pos == 0) {
					transition_probabilities_[s][a].push_back(
						State(3 + 1 * flag_size_, 0.49));
					transition_probabilities_[s][a].push_back(
						State(7 + (xsize_ - 2) * flag_size_, 0.51));
				} else { // Self transition
					transition_probabilities_[s][a].push_back(State(s, 1.0));
				}
			} else if (flag == 3 || flag == 7) { // Transition for remaining steps
				double prob = trap_prob_[next_pos];

				if (1 - prob > 0.0) {
					transition_probabilities_[s][a].push_back(
						State(3 + next_pos * flag_size_, (1 - prob) * 0.49));
					transition_probabilities_[s][a].push_back(
						State(7 + next_pos * flag_size_, (1 - prob) * 0.51));
				}

				if (prob > 0.0) {
					transition_probabilities_[s][a].push_back(
						State(3 + trap_pos_ * flag_size_, prob * 0.49));
					transition_probabilities_[s][a].push_back(
						State(7 + trap_pos_ * flag_size_, prob * 0.51));
				}
			} else { // Self transition
				transition_probabilities_[s][a].push_back(State(s, 1.0));
			}
		}
	}

	// PrintTransitions();
}